

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void Node_Destructor(node *Node)

{
  undefined8 *puVar1;
  nodecontext *p;
  
  if ((Node != (node *)0x0) && (puVar1 = (undefined8 *)Node->VMT, puVar1 != (undefined8 *)0x0)) {
    p = (nodecontext *)*puVar1;
    Node_Notify(Node,0xb);
    CallDelete(p,Node,(nodeclass *)(puVar1 + -9));
    Node->Magic = 0;
    UnlockModules((nodeclass *)(puVar1 + -9));
    return;
  }
  return;
}

Assistant:

void Node_Destructor(node* Node)
{
    if (Node && Node->VMT)
    {
        const nodeclass* Class = NodeGetClass(Node);
        nodecontext* p = Node_Context(Node);

        Node_Notify(Node,NODE_DELETING);

        CallDelete(p,Node,Class);

#ifdef CONFIG_DEBUGCHECKS
        Node->Magic = 0;
#endif

        UnlockModules(Class);
    }
}